

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

Bond_p indigox::CreateBond(void)

{
  Bond *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Bond_p BVar1;
  
  this = (Bond *)operator_new(0x58);
  Bond::Bond(this);
  std::__shared_ptr<indigox::Bond,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<indigox::Bond,void>
            ((__shared_ptr<indigox::Bond,(__gnu_cxx::_Lock_policy)2> *)in_RDI,this);
  BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Bond_p)BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p CreateBond() { return Bond_p(new Bond()); }